

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testSize<Imath_3_2::Vec3<float>>(char *type)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  float *pfVar4;
  char *in_RDI;
  Box<Imath_3_2::Vec3<float>_> b_1;
  Vec3<float> max;
  Vec3<float> min;
  Box<Imath_3_2::Vec3<float>_> b1;
  uint i;
  Vec3<float> p;
  Box<Imath_3_2::Vec3<float>_> b0;
  Box<Imath_3_2::Vec3<float>_> b;
  Vec3<float> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar5;
  float in_stack_fffffffffffffeec;
  Box<Imath_3_2::Vec3<float>_> *in_stack_fffffffffffffef0;
  Vec3<float> local_f0;
  Vec3<float> local_e4;
  Vec3<float> local_d8;
  Vec3<float> local_cc;
  Vec3<float> local_c0 [4];
  uint local_90;
  Vec3<float> local_8c;
  Vec3<float> local_80;
  Vec3<float> local_74;
  Vec3<float> local_68;
  Vec3<float> local_5c [3];
  Vec3<float> local_38;
  Vec3<float> local_2c [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    size() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            ((Box<Imath_3_2::Vec3<float>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::size
            ((Box<Imath_3_2::Vec3<float>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Imath_3_2::Vec3<float>::Vec3(&local_38,0.0);
  bVar1 = Imath_3_2::Vec3<float>::operator==(local_2c,&local_38);
  if (!bVar1) {
    __assert_fail("b.size () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x268,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec3<float>]")
    ;
  }
  Imath_3_2::Vec3<float>::Vec3(local_5c,-1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_68,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffef0,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::size
            ((Box<Imath_3_2::Vec3<float>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Imath_3_2::Vec3<float>::Vec3(&local_80,2.0);
  bVar1 = Imath_3_2::Vec3<float>::operator==(&local_74,&local_80);
  if (!bVar1) {
    __assert_fail("b0.size () == T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x27a,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec3<float>]")
    ;
  }
  Imath_3_2::Vec3<float>::Vec3(&local_8c);
  local_90 = 0;
  while( true ) {
    uVar5 = local_90;
    uVar2 = Imath_3_2::Vec3<float>::dimensions();
    if (uVar2 <= uVar5) break;
    in_stack_fffffffffffffee4 = (float)local_90;
    pfVar4 = Imath_3_2::Vec3<float>::operator[](&local_8c,local_90);
    *pfVar4 = in_stack_fffffffffffffee4;
    local_90 = local_90 + 1;
  }
  Imath_3_2::Vec3<float>::operator-(in_stack_fffffffffffffed8);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffef0,(Vec3<float> *)CONCAT44(in_stack_fffffffffffffeec,uVar5),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::size
            ((Box<Imath_3_2::Vec3<float>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar5));
  Imath_3_2::Vec3<float>::Vec3(&local_d8,2.0);
  Imath_3_2::Vec3<float>::operator*
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffeec,uVar5),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  bVar1 = Imath_3_2::Vec3<float>::operator==(local_c0,&local_cc);
  if (!bVar1) {
    __assert_fail("b1.size () == p * T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x282,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec3<float>]")
    ;
  }
  Imath_3_2::Vec3<float>::Vec3(&local_e4,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_f0,&local_e4);
  uVar2 = Imath_3_2::Vec3<float>::dimensions();
  pfVar4 = Imath_3_2::Vec3<float>::operator[](&local_f0,uVar2 - 1);
  *pfVar4 = 1.0;
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffef0,(Vec3<float> *)CONCAT44(in_stack_fffffffffffffeec,uVar5),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::size
            ((Box<Imath_3_2::Vec3<float>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar5));
  bVar1 = Imath_3_2::Vec3<float>::operator==((Vec3<float> *)&stack0xfffffffffffffeec,&local_f0);
  if (!bVar1) {
    __assert_fail("b.size () == max",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x293,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec3<float>]")
    ;
  }
  return;
}

Assistant:

void
testSize (const char* type)
{
    cout << "    size() for type " << type << endl;

    //
    // Size of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (b.size () == T (0));
    }

    //
    // Size of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ]
    //
    // and
    //
    //    2D: [(-1, -2),         (1, 2)       ]
    //    3D: [(-1, -2, -3),     (1, 2, 3)    ]
    //    4D: [(-1, -2, -3, -4), (1, 2, 3, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.size () == T (2));

        T p;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            p[i] = static_cast<typename T::BaseType>(i);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (-p, p);
        assert (b1.size () == p * T (2));
    }

    //
    // Size of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 1)      ]
    //    3D: [(0, 0, 0),    (0, 0, 1)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 1)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 1;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (b.size () == max);
    }
}